

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadTorus>::TPZGeoElRefLess(TPZGeoElRefLess<pzgeom::TPZQuadTorus> *this)

{
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoElSideIndex *in_stack_ffffffffffffff70;
  TPZQuadTorus *in_stack_ffffffffffffff90;
  TPZCompEl **local_60;
  TPZGeoElSideIndex local_40;
  int local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZQuadTorus>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0245e290);
  TPZGeoEl::TPZGeoEl(in_RDI,&PTR_PTR_0245e278);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245df78;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245df78;
  pzgeom::TPZQuadTorus::TPZQuadTorus(in_stack_ffffffffffffff90);
  local_60 = &in_RDI[7].fReference;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff70);
    local_60 = local_60 + 3;
  } while (local_60 != (TPZCompEl **)&in_RDI[10].fNumInterfaces);
  for (local_28 = 0; local_28 < 9; local_28 = local_28 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff70);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[7].fReference + (long)local_28 * 3),&local_40);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1712fea);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}